

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.cc
# Opt level: O1

string * __thiscall
iqxmlrpc::http::Request_header::host_abi_cxx11_(string *__return_storage_ptr__,Request_header *this)

{
  string local_40;
  
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,&names::host,0x171a79);
  Header::get_option<std::__cxx11::string>(__return_storage_ptr__,&this->super_Header,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Request_header::host() const
{
  return get_string(names::host);
}